

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::TPZDohrPrecond
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this,
          TPZDohrMatrix<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *origin,
          TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *assemble)

{
  int iVar1;
  TPZDohrMatrix<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  long *plVar2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  *in_stack_ffffffffffffffd8;
  list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  TPZMatrix<std::complex<double>_>::TPZMatrix
            ((TPZMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
             ,in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__TPZDohrPrecond_025a5228;
  TPZDohrMatrix<std::complex<double>,TPZDohrSubstruct<std::complex<double>>>::
  SubStructures_abi_cxx11_
            ((TPZDohrMatrix<std::complex<double>,TPZDohrSubstruct<std::complex<double>>> *)in_RSI);
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  ::list(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[7] = 0;
  plVar2 = in_RDI + 8;
  iVar1 = TPZDohrMatrix<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::NumCoarse
                    (in_RSI);
  *plVar2 = (long)iVar1;
  *(undefined4 *)(in_RDI + 9) = 0;
  TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)(in_RDI + 10),
             (TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar1 = TPZDohrMatrix<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::NumThreads
                    (in_RSI);
  *(int *)(in_RDI + 9) = iVar1;
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(TPZDohrMatrix<TVar, TSubStruct> &origin, TPZAutoPointer<TPZDohrAssembly<TVar> > assemble)
: TPZMatrix<TVar>(origin), fGlobal(origin.SubStructures()), fCoarse(0), fNumCoarse(origin.NumCoarse()), fNumThreads(0), fAssemble(assemble)
{
	fNumThreads = origin.NumThreads();
}